

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

size_t hpa_try_alloc_batch_no_grow
                 (tsdn_t *tsdn,hpa_shard_t *shard,size_t size,_Bool *oom,size_t nallocs,
                 edata_list_active_t *results,_Bool *deferred_work_generated)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pthread_mutex_t *__mutex;
  edata_cache_fast_t *ecs;
  psset_t *psset;
  uint uVar3;
  _func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *p_Var4;
  edata_t *peVar5;
  _Bool _Var6;
  int iVar7;
  edata_t *edata;
  hpa_shard_t *phVar8;
  void *pvVar9;
  hpdata_t *phVar10;
  hpdata_t *ps;
  size_t sVar11;
  size_t sVar12;
  
  __mutex = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
  iVar7 = pthread_mutex_trylock(__mutex);
  if (iVar7 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (nallocs == 0) {
    sVar12 = 0;
  }
  else {
    ecs = &shard->ecf;
    psset = &shard->psset;
    sVar11 = 0;
    while( true ) {
      edata = duckdb_je_edata_cache_fast_get(tsdn,ecs);
      if (edata == (edata_t *)0x0) {
        *oom = true;
        edata = (edata_t *)0x0;
      }
      else {
        phVar8 = (hpa_shard_t *)duckdb_je_psset_pick_alloc(psset,size);
        if (phVar8 == (hpa_shard_t *)0x0) {
          duckdb_je_edata_cache_fast_put(tsdn,ecs,edata);
          edata = (edata_t *)0x0;
        }
        else {
          duckdb_je_psset_update_begin(psset,(hpdata_t *)phVar8);
          if ((phVar8->mtx).field_0.witness.link.qre_prev == (witness_t *)0x0) {
            p_Var4 = (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr
                      *)shard->age_counter;
            shard->age_counter = (uint64_t)(p_Var4 + 1);
            (phVar8->pai).alloc_batch = p_Var4;
          }
          pvVar9 = duckdb_je_hpdata_reserve_alloc((hpdata_t *)phVar8,size);
          uVar3 = shard->ind;
          p_Var4 = (phVar8->pai).alloc_batch;
          edata->e_addr = pvVar9;
          (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | size;
          edata->e_sn = (uint64_t)p_Var4;
          edata->e_bits =
               edata->e_bits & 0xffffeffff0000000 | (ulong)uVar3 & 0xffffeffffe800fff | 0xe806000;
          edata->e_ps = (hpdata_t *)phVar8;
          _Var6 = duckdb_je_emap_register_boundary(tsdn,shard->emap,edata,0xe8,false);
          if (_Var6) {
            duckdb_je_hpdata_unreserve
                      ((hpdata_t *)phVar8,edata->e_addr,
                       (edata->field_2).e_size_esn & 0xfffffffffffff000);
            duckdb_je_psset_update_end(psset,(hpdata_t *)phVar8);
            duckdb_je_edata_cache_fast_put(tsdn,ecs,edata);
            *oom = true;
            edata = (edata_t *)0x0;
          }
          else {
            hpa_update_purge_hugify_eligibility((tsdn_t *)shard,phVar8,ps);
            duckdb_je_psset_update_end(psset,(hpdata_t *)phVar8);
          }
        }
      }
      sVar12 = sVar11;
      if (edata == (edata_t *)0x0) break;
      (edata->field_5).ql_link_active.qre_next = edata;
      (edata->field_5).ql_link_active.qre_prev = edata;
      peVar5 = (results->head).qlh_first;
      if (peVar5 != (edata_t *)0x0) {
        (edata->field_5).ql_link_active.qre_next = (peVar5->field_5).ql_link_active.qre_prev;
        (((results->head).qlh_first)->field_5).ql_link_active.qre_prev = edata;
        (edata->field_5).ql_link_active.qre_prev =
             (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        peVar5 = (results->head).qlh_first;
        (((peVar5->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar5;
        (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = edata;
      }
      (results->head).qlh_first = (edata->field_5).ql_link_active.qre_next;
      if ((edata == (edata_t *)0x0) || (sVar11 = sVar11 + 1, sVar12 = nallocs, nallocs == sVar11))
      break;
    }
  }
  phVar8 = shard;
  hpa_shard_maybe_do_deferred_work(tsdn,shard,false);
  phVar10 = duckdb_je_psset_pick_hugify(&shard->psset);
  _Var6 = true;
  if (phVar10 == (hpdata_t *)0x0) {
    _Var6 = hpa_should_purge((tsdn_t *)shard,phVar8);
  }
  *deferred_work_generated = _Var6;
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return sVar12;
}

Assistant:

static size_t
hpa_try_alloc_batch_no_grow(tsdn_t *tsdn, hpa_shard_t *shard, size_t size,
    bool *oom, size_t nallocs, edata_list_active_t *results,
    bool *deferred_work_generated) {
	malloc_mutex_lock(tsdn, &shard->mtx);
	size_t nsuccess = 0;
	for (; nsuccess < nallocs; nsuccess++) {
		edata_t *edata = hpa_try_alloc_one_no_grow(tsdn, shard, size,
		    oom);
		if (edata == NULL) {
			break;
		}
		edata_list_active_append(results, edata);
	}

	hpa_shard_maybe_do_deferred_work(tsdn, shard, /* forced */ false);
	*deferred_work_generated = hpa_shard_has_deferred_work(tsdn, shard);
	malloc_mutex_unlock(tsdn, &shard->mtx);
	return nsuccess;
}